

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

ostream * add_options(ostream *o,MetaContainer meta)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  bool bVar6;
  MetaContainer *pMVar7;
  MetaIterator MVar8;
  MetaIterator MVar9;
  MetaIterator __begin1;
  string sym_names;
  MetaIterator local_70;
  ostream *local_60;
  MetaContainer local_58;
  long local_50 [4];
  
  pMVar7 = &local_58;
  local_60 = o;
  local_58.str_ptr = meta.str_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"xyzabcdefghijklmnopqrstuvw",(allocator<char> *)&local_70);
  local_70 = rtosc::Port::MetaContainer::begin(pMVar7);
  MVar8 = rtosc::Port::MetaContainer::end(pMVar7);
  bVar6 = false;
  while (local_70.title != MVar8.title) {
    pcVar3 = strstr(local_70.title,"map ");
    bVar6 = (bool)(bVar6 | pcVar3 != (char *)0x0);
    rtosc::Port::MetaIterator::operator++(&local_70);
  }
  pMVar7 = &local_58;
  MVar8 = rtosc::Port::MetaContainer::begin(pMVar7);
  local_70 = MVar8;
  MVar9 = rtosc::Port::MetaContainer::end(pMVar7);
  pcVar3 = MVar8.title;
  while (pcVar3 != MVar9.title) {
    iVar2 = strcmp(pcVar3,"documentation");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar3,"parameter");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar3,"max");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar3,"min");
          if (iVar2 != 0) {
            printf("m.title = <%s>\n",pcVar3);
          }
        }
      }
    }
    rtosc::Port::MetaIterator::operator++(&local_70);
    pcVar3 = local_70.title;
  }
  if (bVar6) {
    std::operator<<(local_60,"    <hints>\n");
    pMVar7 = &local_58;
    MVar8 = rtosc::Port::MetaContainer::begin(pMVar7);
    local_70 = MVar8;
    MVar9 = rtosc::Port::MetaContainer::end(pMVar7);
    iVar2 = 0;
    pcVar3 = MVar8.title;
    while (pcVar3 != MVar9.title) {
      pcVar1 = local_70.value;
      pcVar4 = strstr(pcVar3,"map ");
      if (pcVar4 != (char *)0x0) {
        poVar5 = std::operator<<(local_60,"      <point symbol=\"");
        poVar5 = std::operator<<(poVar5,*(char *)(local_50[0] + iVar2));
        std::operator<<(poVar5,"\" value=\"");
        poVar5 = std::operator<<(local_60,pcVar3 + 4);
        poVar5 = std::operator<<(poVar5,"\">");
        poVar5 = std::operator<<(poVar5,pcVar1);
        std::operator<<(poVar5,"</point>\n");
        iVar2 = iVar2 + 1;
      }
      rtosc::Port::MetaIterator::operator++(&local_70);
      pcVar3 = local_70.title;
    }
    std::operator<<(local_60,"    </hints>\n");
  }
  std::__cxx11::string::~string((string *)local_50);
  return local_60;
}

Assistant:

static ostream &add_options(ostream &o, Port::MetaContainer meta)
{
    string sym_names = "xyzabcdefghijklmnopqrstuvw";
    int sym_idx = 0;
    bool has_options = false;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            has_options = true;
    for(auto m:meta)
        if(strcmp(m.title, "documentation") &&
                strcmp(m.title, "parameter") &&
                strcmp(m.title, "max") &&
                strcmp(m.title, "min"))
        printf("m.title = <%s>\n", m.title);

    if(!has_options)
        return o;

    o << "    <hints>\n";
    for(auto m:meta) {
        if(strstr(m.title, "map ")) {
            o << "      <point symbol=\"" << sym_names[sym_idx++] << "\" value=\"";
            o << m.title+4 << "\">" << m.value << "</point>\n";
        }
    }
    o << "    </hints>\n";

    return o;
}